

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O1

SUNErrCode SUNHashMap_Destroy(SUNHashMap *map)

{
  SUNHashMap pSVar1;
  SUNStlVector_SUNHashMapKeyValue __ptr;
  bool bVar2;
  SUNErrCode SVar3;
  long lVar4;
  long lVar5;
  SUNErrCode unaff_R15D;
  
  if (map == (SUNHashMap *)0x0) {
    return 0;
  }
  pSVar1 = *map;
  __ptr = pSVar1->buckets;
  SVar3 = 0;
  if (__ptr != (SUNStlVector_SUNHashMapKeyValue)0x0) {
    bVar2 = 0 < __ptr->size;
    SVar3 = 0;
    if (0 < __ptr->size) {
      bVar2 = true;
      lVar4 = 0;
      lVar5 = 0;
      do {
        SVar3 = (*__ptr->destroyValue)((SUNHashMapKeyValue *)((long)__ptr->values + lVar4));
        if (SVar3 != 0) break;
        *(undefined8 *)((long)__ptr->values + lVar4) = 0;
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 8;
        bVar2 = lVar5 < __ptr->size;
        SVar3 = unaff_R15D;
      } while (lVar5 < __ptr->size);
    }
    if (!bVar2) {
      free(__ptr->values);
      free(__ptr);
      pSVar1->buckets = (SUNStlVector_SUNHashMapKeyValue)0x0;
      SVar3 = 0;
    }
  }
  if (SVar3 == 0) {
    free(*map);
    *map = (SUNHashMap)0x0;
    SVar3 = 0;
  }
  return SVar3;
}

Assistant:

SUNErrCode SUNHashMap_Destroy(SUNHashMap* map)
{
  if (map == NULL) { return SUN_SUCCESS; }

  SUNErrCode err = SUNStlVector_SUNHashMapKeyValue_Destroy(&(*map)->buckets);
  if (err) { return err; }
  free(*map);
  *map = NULL;

  return SUN_SUCCESS;
}